

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTypes.cpp
# Opt level: O3

HaI32 dgVertexListToIndexList
                (HaF32 *vertList,HaI32 strideInBytes,HaI32 floatSizeInBytes,
                HaI32 unsignedSizeInBytes,HaI32 vertexCount,HaI32 *indexList,HaF32 tolerance)

{
  HaF32 *pHVar1;
  HaF64 *pHVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  uint uVar12;
  HaF64 *vertList_00;
  int iVar13;
  ulong uVar14;
  HaF64 *pHVar15;
  HaF32 *pHVar16;
  ulong uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  
  if (unsignedSizeInBytes != 0) {
    __assert_fail("!unsignedSizeInBytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTypes.cpp"
                  ,0x195,
                  "hacd::HaI32 dgVertexListToIndexList(hacd::HaF32 *const, hacd::HaI32, hacd::HaI32, hacd::HaI32, hacd::HaI32, hacd::HaI32 *const, hacd::HaF32)"
                 );
  }
  iVar13 = strideInBytes >> 2;
  vertList_00 = (HaF64 *)malloc((long)(iVar13 * vertexCount * 8));
  if (-1 < iVar13 * vertexCount) {
    if (0 < vertexCount) {
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar14 = 0;
      auVar20 = vpbroadcastq_avx512f();
      pHVar15 = vertList_00;
      pHVar16 = vertList;
      do {
        if (0 < iVar13) {
          uVar17 = 0;
          do {
            auVar21 = vpbroadcastq_avx512f();
            auVar21 = vporq_avx512f(auVar21,auVar19);
            uVar11 = vpcmpuq_avx512f(auVar21,auVar20,2);
            pHVar1 = pHVar16 + uVar17;
            auVar18._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * (int)pHVar1[1];
            auVar18._0_4_ = (uint)((byte)uVar11 & 1) * (int)*pHVar1;
            auVar18._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * (int)pHVar1[2];
            auVar18._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * (int)pHVar1[3];
            auVar18._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * (int)pHVar1[4];
            auVar18._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * (int)pHVar1[5];
            auVar18._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * (int)pHVar1[6];
            auVar18._28_4_ = (uint)(byte)(uVar11 >> 7) * (int)pHVar1[7];
            auVar21 = vcvtps2pd_avx512f(auVar18);
            pHVar2 = pHVar15 + uVar17;
            bVar4 = (bool)((byte)uVar11 & 1);
            bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
            *pHVar2 = (HaF64)((ulong)bVar4 * auVar21._0_8_ | (ulong)!bVar4 * (long)*pHVar2);
            pHVar2[1] = (HaF64)((ulong)bVar5 * auVar21._8_8_ | (ulong)!bVar5 * (long)pHVar2[1]);
            pHVar2[2] = (HaF64)((ulong)bVar6 * auVar21._16_8_ | (ulong)!bVar6 * (long)pHVar2[2]);
            pHVar2[3] = (HaF64)((ulong)bVar7 * auVar21._24_8_ | (ulong)!bVar7 * (long)pHVar2[3]);
            pHVar2[4] = (HaF64)((ulong)bVar8 * auVar21._32_8_ | (ulong)!bVar8 * (long)pHVar2[4]);
            pHVar2[5] = (HaF64)((ulong)bVar9 * auVar21._40_8_ | (ulong)!bVar9 * (long)pHVar2[5]);
            pHVar2[6] = (HaF64)((ulong)bVar10 * auVar21._48_8_ | (ulong)!bVar10 * (long)pHVar2[6]);
            pHVar2[7] = (HaF64)((uVar11 >> 7) * auVar21._56_8_ |
                               (ulong)!SUB81(uVar11 >> 7,0) * (long)pHVar2[7]);
            uVar17 = uVar17 + 8;
          } while ((iVar13 + 7U & 0xfffffff8) != uVar17);
        }
        uVar14 = uVar14 + 1;
        pHVar16 = pHVar16 + iVar13;
        pHVar15 = pHVar15 + iVar13;
      } while (uVar14 != (uint)vertexCount);
    }
    uVar12 = dgVertexListToIndexList
                       (vertList_00,iVar13 * 8,floatSizeInBytes >> 2,vertexCount,indexList,
                        (HaF64)(double)(float)tolerance);
    if (0 < (int)uVar12) {
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar14 = 0;
      auVar20 = vpbroadcastq_avx512f();
      pHVar15 = vertList_00;
      do {
        if (0 < iVar13) {
          uVar17 = 0;
          do {
            auVar21 = vpbroadcastq_avx512f();
            auVar21 = vporq_avx512f(auVar21,auVar19);
            uVar11 = vpcmpuq_avx512f(auVar21,auVar20,2);
            pHVar2 = pHVar15 + uVar17;
            auVar21._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * (long)pHVar2[1];
            auVar21._0_8_ = (ulong)((byte)uVar11 & 1) * (long)*pHVar2;
            auVar21._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * (long)pHVar2[2];
            auVar21._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * (long)pHVar2[3];
            auVar21._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * (long)pHVar2[4];
            auVar21._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * (long)pHVar2[5];
            auVar21._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * (long)pHVar2[6];
            auVar21._56_8_ = (uVar11 >> 7) * (long)pHVar2[7];
            auVar18 = vcvtpd2ps_avx512f(auVar21);
            pHVar16 = vertList + uVar17;
            bVar4 = (bool)((byte)uVar11 & 1);
            bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
            bVar3 = SUB81(uVar11 >> 7,0);
            *pHVar16 = (HaF32)((uint)bVar4 * auVar18._0_4_ | (uint)!bVar4 * (int)*pHVar16);
            pHVar16[1] = (HaF32)((uint)bVar5 * auVar18._4_4_ | (uint)!bVar5 * (int)pHVar16[1]);
            pHVar16[2] = (HaF32)((uint)bVar6 * auVar18._8_4_ | (uint)!bVar6 * (int)pHVar16[2]);
            pHVar16[3] = (HaF32)((uint)bVar7 * auVar18._12_4_ | (uint)!bVar7 * (int)pHVar16[3]);
            pHVar16[4] = (HaF32)((uint)bVar8 * auVar18._16_4_ | (uint)!bVar8 * (int)pHVar16[4]);
            pHVar16[5] = (HaF32)((uint)bVar9 * auVar18._20_4_ | (uint)!bVar9 * (int)pHVar16[5]);
            pHVar16[6] = (HaF32)((uint)bVar10 * auVar18._24_4_ | (uint)!bVar10 * (int)pHVar16[6]);
            pHVar16[7] = (HaF32)((uint)bVar3 * auVar18._28_4_ | (uint)!bVar3 * (int)pHVar16[7]);
            uVar17 = uVar17 + 8;
          } while ((iVar13 + 7U & 0xfffffff8) != uVar17);
        }
        uVar14 = uVar14 + 1;
        pHVar15 = pHVar15 + iVar13;
        vertList = vertList + iVar13;
      } while (uVar14 != uVar12);
    }
    free(vertList_00);
    return uVar12;
  }
  __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                ,0x60,"T &dgStack<double>::operator[](hacd::HaI32) [T = double]");
}

Assistant:

hacd::HaI32 dgVertexListToIndexList (hacd::HaF32* const vertList, hacd::HaI32 strideInBytes, hacd::HaI32 floatSizeInBytes, hacd::HaI32 unsignedSizeInBytes, hacd::HaI32 vertexCount, hacd::HaI32* const indexList, hacd::HaF32 tolerance)
{
	HACD_FORCE_PARAMETER_REFERENCE(unsignedSizeInBytes);
	hacd::HaI32 stride = strideInBytes / sizeof (hacd::HaF32);

	HACD_ASSERT (!unsignedSizeInBytes);
	dgStack<hacd::HaF64> pool(vertexCount * stride);

	hacd::HaI32 floatCount = floatSizeInBytes / sizeof (hacd::HaF32);

	hacd::HaF64* const data = &pool[0];
	for (hacd::HaI32 i = 0; i < vertexCount; i ++) {

		hacd::HaF64* const dst = &data[i * stride];
		hacd::HaF32* const src = &vertList[i * stride];
		for (hacd::HaI32 j = 0; j < stride; j ++) {
			dst[j] = src[j];
		}
	}

	hacd::HaI32 count = dgVertexListToIndexList (data, stride * sizeof (hacd::HaF64), floatCount, vertexCount, indexList, hacd::HaF64 (tolerance));
	for (hacd::HaI32 i = 0; i < count; i ++) {
		hacd::HaF64* const src = &data[i * stride];
		hacd::HaF32* const dst = &vertList[i * stride];
		for (hacd::HaI32 j = 0; j < stride; j ++) {
			dst[j] = hacd::HaF32 (src[j]);
		}
	}
	
	return count;
}